

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_dns_constraints.c
# Opt level: O1

int g(sunrealtype t,N_Vector y,sunrealtype *gout,void *user_data)

{
  double dVar1;
  double *pdVar2;
  
  pdVar2 = *(double **)((long)y->content + 0x10);
  dVar1 = pdVar2[2];
  *gout = *pdVar2 + -0.0001;
  gout[1] = dVar1 + -0.01;
  return 0;
}

Assistant:

static int g(sunrealtype t, N_Vector y, sunrealtype* gout, void* user_data)
{
  sunrealtype y1, y3;

  y1      = Ith(y, 1);
  y3      = Ith(y, 3);
  gout[0] = y1 - SUN_RCONST(0.0001);
  gout[1] = y3 - SUN_RCONST(0.01);

  return (0);
}